

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

solution_t solve(deck_t *f,deck_t *s)

{
  _List_node_base *p_Var1;
  _Self __tmp_1;
  ostream *poVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _Self __tmp_4;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  uint uVar8;
  _Self __tmp;
  string local_68;
  _List_node_base *local_48;
  ulong local_40;
  allocator<char> local_31;
  
  local_40 = 0;
  local_48 = (_List_node_base *)s;
  do {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"deck 1",&local_31);
    dump_deck(&local_68,f);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"deck 2",&local_31);
    dump_deck(&local_68,s);
    std::__cxx11::string::~string((string *)&local_68);
    p_Var5 = (f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var6 = ((_List_node_base *)s)->_M_next;
    do {
      p_Var7 = (_List_node_base *)s;
      if ((*(int *)&p_Var5[1]._M_next < *(int *)&p_Var6[1]._M_next) ||
         (p_Var7 = (_List_node_base *)f, *(int *)&p_Var6[1]._M_next < *(int *)&p_Var5[1]._M_next))
      goto LAB_00102504;
      p_Var7 = p_Var6;
      p_Var4 = (_List_node_base *)f;
    } while ((((p_Var5->_M_next != (_List_node_base *)f) &&
              ((((p_Var5 = (((_List_base<CCard,_std::allocator<CCard>_> *)&p_Var5->_M_next->_M_next)
                           ->_M_impl)._M_node.super__List_node_base._M_next,
                 p_Var5 != (_List_node_base *)f &&
                 (p_Var5 = p_Var5->_M_next, p_Var5 != (_List_node_base *)f)) &&
                (p_Var5 = p_Var5->_M_next, p_Var5 != (_List_node_base *)f)) &&
               ((p_Var7 = (_List_node_base *)s, p_Var4 = p_Var5,
                p_Var6->_M_next != (_List_node_base *)s &&
                (p_Var6 = p_Var6->_M_next->_M_next, p_Var6 != (_List_node_base *)s)))))) &&
             (p_Var6 = p_Var6->_M_next, p_Var6 != (_List_node_base *)s)) &&
            (p_Var6 = p_Var6->_M_next, p_Var6 != (_List_node_base *)s));
    p_Var6 = p_Var7;
    p_Var7 = (_List_node_base *)0x0;
    p_Var5 = p_Var4;
LAB_00102504:
    uVar8 = (int)local_40 + 1;
    poVar2 = std::operator<<((ostream *)&std::cerr,"turn #");
    local_40 = (ulong)uVar8;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    s = (deck_t *)local_48;
    if (p_Var7 != (_List_node_base *)0x0) {
      p_Var4 = (f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      while (s = (deck_t *)local_48, p_Var4 != p_Var5) {
        p_Var1 = p_Var4->_M_next;
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back
                  ((list<CCard,_std::allocator<CCard>_> *)p_Var7,(value_type *)(p_Var4 + 1));
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(f);
        p_Var4 = p_Var1;
      }
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back
                ((list<CCard,_std::allocator<CCard>_> *)p_Var7,(value_type *)(p_Var4 + 1));
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(f);
      p_Var5 = ((_List_node_base *)s)->_M_next;
      while (p_Var5 != p_Var6) {
        p_Var4 = p_Var5->_M_next;
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back
                  ((list<CCard,_std::allocator<CCard>_> *)p_Var7,(value_type *)(p_Var5 + 1));
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(s);
        p_Var5 = p_Var4;
      }
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back
                ((list<CCard,_std::allocator<CCard>_> *)p_Var7,(value_type *)(p_Var5 + 1));
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(s);
    }
    if ((f->super__List_base<CCard,_std::allocator<CCard>_>)._M_impl._M_node.super__List_node_base.
        _M_next == (_List_node_base *)f) {
      uVar3 = 2;
      goto LAB_001025fe;
    }
    p_Var5 = (((_List_base<CCard,_std::allocator<CCard>_> *)&((_List_node_base *)s)->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if ((p_Var7 == (_List_node_base *)0x0) || (p_Var5 == (_List_node_base *)s)) {
      uVar3 = (ulong)(p_Var5 == (_List_node_base *)s);
      local_40 = local_40 & 0xffffffff;
      if (p_Var5 != (_List_node_base *)s) {
        local_40 = 0;
      }
LAB_001025fe:
      return (solution_t)(local_40 << 0x20 | uVar3);
    }
  } while( true );
}

Assistant:

solution_t solve(deck_t f, deck_t s)
{
    int turn = 0;
    
    deck_t* winner;
    do
    {
        winner = NULL;

        dump_deck("deck 1", f);
        dump_deck("deck 2", s);

        // take first cards (fight)
        deck_t::const_iterator c1 = f.begin();
        deck_t::const_iterator c2 = s.begin();
            
        do
        {
            if (*c1 < *c2)
            {
                // second have won
                winner = &s;
            }
            else if (*c2 < *c1)
            {
                // first have won
                winner = &f;
            }
            else
            {
                // equal. war is going to start
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
            }
        } while (NULL == winner);
        turn++;
        
        std::cerr << "turn #" << turn << std::endl;

        if (NULL != winner)
        {
            // move card to the winner
            deck_t::iterator i = f.begin();
            while (i != c1)
            {
                winner->push_back(*i++);
                f.pop_front();
            }
            winner->push_back(*i);
            f.pop_front();

            i = s.begin();
            while (i != c2)
            {
                winner->push_back(*i++);
                s.pop_front();
            }
            winner->push_back(*i);
            s.pop_front();
        }
    } while (!f.empty() && !s.empty() && NULL != winner);
    
    if (f.empty())
    {
        return solution_t(2, turn);
    }
    else if (s.empty())
    {
        return solution_t(1, turn);
    }
    else if (NULL == winner)
    {
        return solution_t(0, 0);    // PAT
    }
    else
    {
        throw std::runtime_error("Unexpected exit");
    }
    
    throw std::runtime_error("Wrong logic");
}